

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O0

void log_ERR_get_error(char *message)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char *in_stack_ffffffffffffff28;
  undefined4 uVar3;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ulong uStack_a0;
  int i;
  unsigned_long error;
  char buf [128];
  char *message_local;
  
  if ((message != (char *)0x0) && (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0))
  {
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/x509_openssl.c"
              ,"log_ERR_get_error",0x21,1,"%s",message);
    in_stack_ffffffffffffff28 = message;
  }
  uStack_a0 = ERR_get_error();
  l._4_4_ = 0;
  while (uStack_a0 != 0) {
    p_Var1 = xlogging_get_log_function();
    uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = ERR_error_string(uStack_a0,(char *)&error);
      in_stack_ffffffffffffff28 = (char *)CONCAT44(uVar3,l._4_4_);
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/x509_openssl.c"
                ,"log_ERR_get_error",0x28,1,"  [%d] %s",in_stack_ffffffffffffff28,pcVar2);
    }
    uStack_a0 = ERR_get_error();
    l._4_4_ = l._4_4_ + 1;
  }
  return;
}

Assistant:

static void log_ERR_get_error(const char* message)
{
    char buf[128];
    AZURE_UNREFERENCED_PARAMETER(buf);
    unsigned long error;
    int i;

    if (message != NULL)
    {
        LogError("%s", message);
    }

    error = ERR_get_error();

    for (i = 0; 0 != error; i++)
    {
        LogError("  [%d] %s", i, ERR_error_string(error, buf));
        error = ERR_get_error();
    }
}